

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.cc
# Opt level: O3

fdb_status fdb_begin_transaction(fdb_file_handle *fhandle,fdb_isolation_level_t isolation_level)

{
  fdb_kvs_handle *handle;
  filemgr *file;
  fdb_txn *pfVar1;
  wal_txn_wrapper *pwVar2;
  uint64_t uVar3;
  __int_type _Var4;
  list *plVar5;
  fdb_status fVar6;
  bool bVar7;
  
  fVar6 = FDB_RESULT_INVALID_HANDLE;
  if ((((fhandle != (fdb_file_handle *)0x0) &&
       (handle = fhandle->root, handle != (fdb_kvs_handle *)0x0)) &&
      (fVar6 = FDB_RESULT_TRANSACTION_FAIL, handle->txn == (fdb_txn *)0x0)) &&
     ((handle->kvs == (kvs_info *)0x0 ||
      (fVar6 = FDB_RESULT_INVALID_HANDLE, handle->kvs->type != '\x01')))) {
    LOCK();
    bVar7 = (handle->handle_busy).super___atomic_base<unsigned_char>._M_i == '\0';
    if (bVar7) {
      (handle->handle_busy).super___atomic_base<unsigned_char>._M_i = '\x01';
    }
    UNLOCK();
    fVar6 = FDB_RESULT_HANDLE_BUSY;
    if (bVar7) {
      while( true ) {
        fdb_check_file_reopen(handle,(file_status_t *)0x0);
        filemgr_mutex_lock(handle->file);
        fdb_sync_db_header(handle);
        bVar7 = filemgr_is_rollback_on(handle->file);
        if (bVar7) break;
        file = handle->file;
        if ((file->status).super___atomic_base<unsigned_char>._M_i != '\x04') {
          pfVar1 = (fdb_txn *)malloc(0x38);
          handle->txn = pfVar1;
          pwVar2 = (wal_txn_wrapper *)malloc(0x18);
          pfVar1->wrapper = pwVar2;
          (pwVar2->field_1).txn = pfVar1;
          pfVar1->handle = handle;
          LOCK();
          UNLOCK();
          uVar3 = (long)transaction_id.super___atomic_base<unsigned_long>._M_i + 1;
          transaction_id.super___atomic_base<unsigned_long>._M_i =
               (__atomic_base<unsigned_long>)
               (__atomic_base<unsigned_long>)
               (transaction_id.super___atomic_base<unsigned_long>._M_i + 1)._M_i;
          handle->txn->txn_id = uVar3;
          _Var4 = 0xffffffffffffffff;
          if ((handle->file->status).super___atomic_base<unsigned_char>._M_i != '\x01') {
            _Var4 = (handle->last_hdr_bid).super___atomic_base<unsigned_long>._M_i;
          }
          handle->txn->prev_hdr_bid = _Var4;
          pfVar1 = handle->txn;
          pfVar1->prev_revnum = (handle->cur_header_revnum).super___atomic_base<unsigned_long>._M_i;
          plVar5 = (list *)calloc(1,0x10);
          pfVar1->items = plVar5;
          pfVar1->isolation = isolation_level;
          wal_add_transaction(file,pfVar1);
          filemgr_mutex_unlock(file);
          fVar6 = FDB_RESULT_SUCCESS;
          goto LAB_0014833c;
        }
        filemgr_mutex_unlock(file);
      }
      filemgr_mutex_unlock(handle->file);
      fVar6 = FDB_RESULT_FAIL_BY_ROLLBACK;
LAB_0014833c:
      LOCK();
      if ((handle->handle_busy).super___atomic_base<unsigned_char>._M_i == '\x01') {
        (handle->handle_busy).super___atomic_base<unsigned_char>._M_i = '\0';
      }
      UNLOCK();
    }
  }
  return fVar6;
}

Assistant:

LIBFDB_API
fdb_status fdb_begin_transaction(fdb_file_handle *fhandle,
                                 fdb_isolation_level_t isolation_level)
{
    if (!fhandle || !fhandle->root) {
        return FDB_RESULT_INVALID_HANDLE;
    }

    file_status_t fstatus;
    fdb_kvs_handle *handle = fhandle->root;
    struct filemgr *file;

    if (handle->txn) {
        // transaction already exists
        return FDB_RESULT_TRANSACTION_FAIL;
    }
    if (handle->kvs) {
        if (handle->kvs->type == KVS_SUB) {
            // deny transaction on sub handle
            return FDB_RESULT_INVALID_HANDLE;
        }
    }

    if (!atomic_cas_uint8_t(&handle->handle_busy, 0, 1)) {
        return FDB_RESULT_HANDLE_BUSY;
    }

    do { // repeat until file status is not REMOVED_PENDING
        fdb_check_file_reopen(handle, NULL);
        filemgr_mutex_lock(handle->file);
        fdb_sync_db_header(handle);

        if (filemgr_is_rollback_on(handle->file)) {
            // deny beginning transaction during rollback
            filemgr_mutex_unlock(handle->file);
            atomic_cas_uint8_t(&handle->handle_busy, 1, 0);
            return FDB_RESULT_FAIL_BY_ROLLBACK;
        }

        file = handle->file;
        fstatus = filemgr_get_file_status(file);
        if (fstatus == FILE_REMOVED_PENDING) {
            // we must not create transaction on this file
            // file status was changed by other thread .. start over
            filemgr_mutex_unlock(file);
        }
    } while (fstatus == FILE_REMOVED_PENDING);

    handle->txn = (fdb_txn*)malloc(sizeof(fdb_txn));
    handle->txn->wrapper = (struct wal_txn_wrapper *)
                           malloc(sizeof(struct wal_txn_wrapper));
    handle->txn->wrapper->txn = handle->txn;
    handle->txn->handle = handle;
    handle->txn->txn_id = ++transaction_id;

    if (filemgr_get_file_status(handle->file) != FILE_COMPACT_OLD) {
        // keep previous header's BID
        handle->txn->prev_hdr_bid = handle->last_hdr_bid;
    } else {
        // if file status is COMPACT_OLD,
        // then this transaction will work on new file, and
        // there is no previous header until the compaction is done.
        handle->txn->prev_hdr_bid = BLK_NOT_FOUND;
    }
    handle->txn->prev_revnum = handle->cur_header_revnum;
    handle->txn->items = (struct list *)malloc(sizeof(struct list));
    handle->txn->isolation = isolation_level;
    list_init(handle->txn->items);
    wal_add_transaction(file, handle->txn);

    filemgr_mutex_unlock(file);

    atomic_cas_uint8_t(&handle->handle_busy, 1, 0);
    return FDB_RESULT_SUCCESS;
}